

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
clog::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
take(BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this)

{
  bool bVar1;
  reference pvVar2;
  anon_class_8_1_8991fb9c in_RSI;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *front;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,&(in_RSI.this)->_mutex);
  std::condition_variable::wait<clog::BlockingQueue<std::__cxx11::string>::take()::_lambda()_1_>
            (&(in_RSI.this)->_notEmpty,(unique_lock<std::mutex> *)local_28,in_RSI);
  bVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(in_RSI.this)->_queue);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&(in_RSI.this)->_queue);
    std::__cxx11::string::string((string *)this,(string *)pvVar2);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&(in_RSI.this)->_queue);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
    return this;
  }
  __assert_fail("!_queue.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bigYellowDuck[P]clog/BlockingQueue.h"
                ,0x37,
                "T clog::BlockingQueue<std::basic_string<char>>::take() [T = std::basic_string<char>]"
               );
}

Assistant:

T take()
    {
        std::unique_lock<std::mutex> lock(_mutex);
        _notEmpty.wait(lock, [this]{ return !this->_queue.empty(); });
        
        assert(!_queue.empty());
        T front(std::move(_queue.front()));
        _queue.pop_front();
    
        return front;
    }